

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8proc.c
# Opt level: O1

utf8proc_ssize_t
utf8proc_reencode(utf8proc_int32_t *buffer,utf8proc_ssize_t length,utf8proc_option_t options)

{
  ushort uVar1;
  ushort uVar2;
  ushort uVar3;
  uint uVar4;
  utf8proc_ssize_t uVar5;
  byte bVar6;
  ushort uVar7;
  long lVar8;
  int iVar9;
  uint uVar10;
  long lVar11;
  uint *puVar12;
  long lVar13;
  utf8proc_property_t *puVar14;
  long lVar15;
  
  lVar13 = length;
  if ((options & (UTF8PROC_STRIPCC|UTF8PROC_NLF2LF)) != 0) {
    if (length < 1) {
      lVar13 = 0;
    }
    else {
      lVar11 = 0;
      lVar13 = 0;
      do {
        iVar9 = buffer[lVar11];
        if ((lVar11 < length + -1 && iVar9 == 0xd) && (buffer[lVar11 + 1] == 10)) {
          lVar11 = lVar11 + 1;
        }
        if ((((iVar9 == 10) || (iVar9 == 0xd)) || (iVar9 == 0x85)) ||
           (((options >> 9 & 1) != 0 && (iVar9 - 0xbU < 2)))) {
          lVar15 = lVar13 + 1;
          if ((char)options < '\0') {
            if ((options >> 8 & 1) == 0) {
              buffer[lVar13] = 0x2028;
              lVar13 = lVar15;
            }
            else {
              buffer[lVar13] = 10;
              lVar13 = lVar15;
            }
          }
          else if ((options >> 8 & 1) == 0) {
            buffer[lVar13] = 0x20;
            lVar13 = lVar15;
          }
          else {
            buffer[lVar13] = 0x2029;
            lVar13 = lVar15;
          }
        }
        else {
          if (((options >> 9 & 1) == 0) || (0x20 < iVar9 - 0x7fU && 0x1f < iVar9)) {
            buffer[lVar13] = iVar9;
          }
          else {
            if (iVar9 != 9) goto LAB_001340f2;
            buffer[lVar13] = 0x20;
          }
          lVar13 = lVar13 + 1;
        }
LAB_001340f2:
        lVar11 = lVar11 + 1;
      } while (lVar11 < length);
    }
  }
  lVar11 = lVar13;
  if (((options & UTF8PROC_COMPOSE) != 0) && (lVar11 = 0, 0 < lVar13)) {
    uVar7 = 0xffff;
    puVar12 = (uint *)0x0;
    puVar14 = (utf8proc_property_t *)0x0;
    lVar15 = 0;
    do {
      uVar4 = buffer[lVar15];
      uVar1 = utf8proc_stage2table[(uVar4 & 0xff) + (uint)utf8proc_stage1table[(int)uVar4 >> 8]];
      if ((puVar12 == (uint *)0x0) || (utf8proc_properties[uVar1].combining_class <= (short)uVar7))
      {
LAB_001342d3:
        buffer[lVar11] = uVar4;
        uVar1 = utf8proc_properties[uVar1].combining_class;
        uVar2 = uVar1;
        if ((short)uVar1 <= (short)uVar7) {
          uVar2 = uVar7;
        }
        uVar7 = -(ushort)(uVar1 == 0) | uVar2;
        if (uVar1 == 0) {
          puVar14 = (utf8proc_property_t *)0x0;
          puVar12 = (uint *)(buffer + lVar11);
        }
        lVar11 = lVar11 + 1;
      }
      else {
        if ((*puVar12 - 0x1100 < 0x13) && (0xffffffea < uVar4 - 0x1176)) {
          *puVar12 = (*puVar12 * 0x15 + uVar4) * 0x1c - 0x28469c;
          iVar9 = 7;
          puVar14 = (utf8proc_property_t *)0x0;
        }
        else {
          uVar10 = *puVar12;
          if (((uVar10 - 0xac00 < 0x2ba4) && (uVar10 + ((uVar10 - 0xac00) / 0x1c) * -0x1c == 0xac00)
              ) && (0xffffffe3 < uVar4 - 0x11c3)) {
            *puVar12 = (uVar4 + uVar10) - 0x11a7;
            iVar9 = 7;
            puVar14 = (utf8proc_property_t *)0x0;
          }
          else {
            if (puVar14 == (utf8proc_property_t *)0x0) {
              puVar14 = utf8proc_properties +
                        utf8proc_stage2table
                        [(*puVar12 & 0xff) + (uint)utf8proc_stage1table[(int)*puVar12 >> 8]];
            }
            uVar2 = puVar14->comb_index;
            iVar9 = 0;
            if (-1 < (short)uVar2) {
              uVar3 = utf8proc_properties[uVar1].comb_index;
              if ((short)uVar3 < -1) {
                iVar9 = (uVar3 & 0x3fff) - (uint)utf8proc_combinations[uVar2];
                if ((iVar9 < 0) || ((int)(uint)utf8proc_combinations[(ulong)uVar2 + 1] < iVar9)) {
                  iVar9 = 0;
                }
                else {
                  uVar10 = (uint)utf8proc_combinations[(ulong)((uint)uVar2 + iVar9) + 2];
                  if ((uVar3 >> 0xe & 1) != 0) {
                    uVar10 = CONCAT22(utf8proc_combinations[(ulong)((uint)uVar2 + iVar9) + 2],
                                      utf8proc_combinations[(ulong)(iVar9 + (uint)uVar2 + 2) + 1]);
                  }
                  iVar9 = 0;
                  if ((0 < (int)uVar10) &&
                     (((options & UTF8PROC_STABLE) == 0 ||
                      ((utf8proc_properties
                        [utf8proc_stage2table
                         [(uVar10 & 0xff) + (uint)utf8proc_stage1table[uVar10 >> 8]]].field_0x14 & 2
                       ) == 0)))) {
                    *puVar12 = uVar10;
                    iVar9 = 7;
                    puVar14 = (utf8proc_property_t *)0x0;
                  }
                }
              }
            }
          }
        }
        if (iVar9 == 0) goto LAB_001342d3;
      }
      lVar15 = lVar15 + 1;
    } while (lVar13 != lVar15);
  }
  if ((options >> 0xb & 1) == 0) {
    if (0 < lVar11) {
      lVar15 = 0;
      lVar13 = 0;
      do {
        uVar5 = utf8proc_encode_char(buffer[lVar13],(utf8proc_uint8_t *)((long)buffer + lVar15));
        lVar15 = lVar15 + uVar5;
        lVar13 = lVar13 + 1;
      } while (lVar11 != lVar13);
      goto LAB_001344df;
    }
  }
  else if (0 < lVar11) {
    lVar15 = 0;
    lVar13 = 0;
    do {
      uVar4 = buffer[lVar13];
      if ((int)uVar4 < 0) {
LAB_001344c9:
        lVar8 = 0;
      }
      else {
        bVar6 = (byte)uVar4;
        if ((int)uVar4 < 0x80) {
          *(byte *)((long)buffer + lVar15) = bVar6;
        }
        else {
          if ((int)uVar4 < 0x800) {
            *(char *)((long)buffer + lVar15) = (char)(uVar4 >> 6) + -0x40;
            *(byte *)((long)buffer + lVar15 + 1) = bVar6 & 0x3f | 0x80;
            lVar8 = 2;
            goto LAB_001344cb;
          }
          if (uVar4 == 0xfffe) {
            *(undefined1 *)((long)buffer + lVar15) = 0xfe;
          }
          else {
            if (uVar4 != 0xffff) {
              if ((int)uVar4 < 0x10000) {
                *(char *)((long)buffer + lVar15) = (char)(uVar4 >> 0xc) + -0x20;
                *(byte *)((long)buffer + lVar15 + 1) = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                *(byte *)((long)buffer + lVar15 + 2) = bVar6 & 0x3f | 0x80;
                lVar8 = 3;
              }
              else {
                if (0x10ffff < (int)uVar4) goto LAB_001344c9;
                *(char *)((long)buffer + lVar15) = (char)(uVar4 >> 0x12) + -0x10;
                *(byte *)((long)buffer + lVar15 + 1) = (byte)(uVar4 >> 0xc) & 0x3f | 0x80;
                *(byte *)((long)buffer + lVar15 + 2) = (byte)(uVar4 >> 6) & 0x3f | 0x80;
                *(byte *)((long)buffer + lVar15 + 3) = bVar6 & 0x3f | 0x80;
                lVar8 = 4;
              }
              goto LAB_001344cb;
            }
            *(undefined1 *)((long)buffer + lVar15) = 0xff;
          }
        }
        lVar8 = 1;
      }
LAB_001344cb:
      lVar15 = lVar15 + lVar8;
      lVar13 = lVar13 + 1;
    } while (lVar11 != lVar13);
    goto LAB_001344df;
  }
  lVar15 = 0;
LAB_001344df:
  *(undefined1 *)((long)buffer + lVar15) = 0;
  return lVar15;
}

Assistant:

UTF8PROC_DLLEXPORT utf8proc_ssize_t utf8proc_reencode(utf8proc_int32_t *buffer, utf8proc_ssize_t length, utf8proc_option_t options) {
  /* UTF8PROC_NULLTERM option will be ignored, 'length' is never ignored
     ASSERT: 'buffer' has one spare byte of free space at the end! */
  if (options & (UTF8PROC_NLF2LS | UTF8PROC_NLF2PS | UTF8PROC_STRIPCC)) {
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t uc;
    for (rpos = 0; rpos < length; rpos++) {
      uc = buffer[rpos];
      if (uc == 0x000D && rpos < length-1 && buffer[rpos+1] == 0x000A) rpos++;
      if (uc == 0x000A || uc == 0x000D || uc == 0x0085 ||
          ((options & UTF8PROC_STRIPCC) && (uc == 0x000B || uc == 0x000C))) {
        if (options & UTF8PROC_NLF2LS) {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x000A;
          } else {
            buffer[wpos++] = 0x2028;
          }
        } else {
          if (options & UTF8PROC_NLF2PS) {
            buffer[wpos++] = 0x2029;
          } else {
            buffer[wpos++] = 0x0020;
          }
        }
      } else if ((options & UTF8PROC_STRIPCC) &&
          (uc < 0x0020 || (uc >= 0x007F && uc < 0x00A0))) {
        if (uc == 0x0009) buffer[wpos++] = 0x0020;
      } else {
        buffer[wpos++] = uc;
      }
    }
    length = wpos;
  }
  if (options & UTF8PROC_COMPOSE) {
    utf8proc_int32_t *starter = NULL;
    utf8proc_int32_t current_char;
    const utf8proc_property_t *starter_property = NULL, *current_property;
    utf8proc_propval_t max_combining_class = -1;
    utf8proc_ssize_t rpos;
    utf8proc_ssize_t wpos = 0;
    utf8proc_int32_t composition;
    for (rpos = 0; rpos < length; rpos++) {
      current_char = buffer[rpos];
      current_property = unsafe_get_property(current_char);
      if (starter && current_property->combining_class > max_combining_class) {
        /* combination perhaps possible */
        utf8proc_int32_t hangul_lindex;
        utf8proc_int32_t hangul_sindex;
        hangul_lindex = *starter - UTF8PROC_HANGUL_LBASE;
        if (hangul_lindex >= 0 && hangul_lindex < UTF8PROC_HANGUL_LCOUNT) {
          utf8proc_int32_t hangul_vindex;
          hangul_vindex = current_char - UTF8PROC_HANGUL_VBASE;
          if (hangul_vindex >= 0 && hangul_vindex < UTF8PROC_HANGUL_VCOUNT) {
            *starter = UTF8PROC_HANGUL_SBASE +
              (hangul_lindex * UTF8PROC_HANGUL_VCOUNT + hangul_vindex) *
              UTF8PROC_HANGUL_TCOUNT;
            starter_property = NULL;
            continue;
          }
        }
        hangul_sindex = *starter - UTF8PROC_HANGUL_SBASE;
        if (hangul_sindex >= 0 && hangul_sindex < UTF8PROC_HANGUL_SCOUNT &&
            (hangul_sindex % UTF8PROC_HANGUL_TCOUNT) == 0) {
          utf8proc_int32_t hangul_tindex;
          hangul_tindex = current_char - UTF8PROC_HANGUL_TBASE;
          if (hangul_tindex >= 0 && hangul_tindex < UTF8PROC_HANGUL_TCOUNT) {
            *starter += hangul_tindex;
            starter_property = NULL;
            continue;
          }
        }
        if (!starter_property) {
          starter_property = unsafe_get_property(*starter);
        }
        if (starter_property->comb_index < 0x8000 &&
            current_property->comb_index != UINT16_MAX &&
            current_property->comb_index >= 0x8000) {
          int sidx = starter_property->comb_index;
          int idx = (current_property->comb_index & 0x3FFF) - utf8proc_combinations[sidx];
          if (idx >= 0 && idx <= utf8proc_combinations[sidx + 1] ) {
            idx += sidx + 2;
            if (current_property->comb_index & 0x4000) {
              composition = (utf8proc_combinations[idx] << 16) | utf8proc_combinations[idx+1];
            } else
              composition = utf8proc_combinations[idx];

            if (composition > 0 && (!(options & UTF8PROC_STABLE) ||
                !(unsafe_get_property(composition)->comp_exclusion))) {
              *starter = composition;
              starter_property = NULL;
              continue;
            }
          }
        }
      }
      buffer[wpos] = current_char;
      if (current_property->combining_class) {
        if (current_property->combining_class > max_combining_class) {
          max_combining_class = current_property->combining_class;
        }
      } else {
        starter = buffer + wpos;
        starter_property = NULL;
        max_combining_class = -1;
      }
      wpos++;
    }
    length = wpos;
  }
  {
    utf8proc_ssize_t rpos, wpos = 0;
    utf8proc_int32_t uc;
    if (options & UTF8PROC_CHARBOUND) {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += unsafe_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    } else {
        for (rpos = 0; rpos < length; rpos++) {
            uc = buffer[rpos];
            wpos += utf8proc_encode_char(uc, ((utf8proc_uint8_t *)buffer) + wpos);
        }
    }
    ((utf8proc_uint8_t *)buffer)[wpos] = 0;
    return wpos;
  }
}